

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucharstrie.cpp
# Opt level: O0

UStringTrieResult __thiscall
icu_63::UCharsTrie::branchNext(UCharsTrie *this,UChar *pos,int32_t length,int32_t uchar)

{
  uint node_00;
  char16_t *pcVar1;
  UStringTrieResult local_48;
  UStringTrieResult local_44;
  uint local_34;
  int32_t node_1;
  int32_t delta;
  int32_t node;
  UStringTrieResult result;
  int32_t uchar_local;
  int32_t length_local;
  UChar *pos_local;
  UCharsTrie *this_local;
  
  result = length;
  _uchar_local = pos;
  if (length == 0) {
    _uchar_local = pos + 1;
    result = (UStringTrieResult)(ushort)*pos;
  }
  result = result + USTRINGTRIE_NO_VALUE;
  while (5 < (int)result) {
    if (uchar < (int)(uint)(ushort)*_uchar_local) {
      _uchar_local = jumpByDelta(_uchar_local + 1);
      result = (int)result >> 1;
    }
    else {
      result = result - ((int)result >> 1);
      _uchar_local = skipDelta(_uchar_local + 1);
    }
  }
  do {
    pcVar1 = _uchar_local + 1;
    if (uchar == (uint)(ushort)*_uchar_local) {
      local_34 = (uint)(ushort)*pcVar1;
      if ((*pcVar1 & 0x8000U) == 0) {
        pcVar1 = _uchar_local + 2;
        if (0x3fff < local_34) {
          if (local_34 < 0x7fff) {
            local_34 = (local_34 - 0x4000) * 0x10000 | (uint)(ushort)*pcVar1;
            pcVar1 = _uchar_local + 3;
          }
          else {
            local_34 = CONCAT22(*pcVar1,_uchar_local[3]);
            pcVar1 = _uchar_local + 4;
          }
        }
        _uchar_local = pcVar1;
        _uchar_local = _uchar_local + (int)local_34;
        if ((ushort)*_uchar_local < 0x40) {
          local_44 = USTRINGTRIE_NO_VALUE;
        }
        else {
          local_44 = valueResult((uint)(ushort)*_uchar_local);
        }
        delta = local_44;
      }
      else {
        delta = 2;
        _uchar_local = pcVar1;
      }
      this->pos_ = _uchar_local;
      return delta;
    }
    result = result - USTRINGTRIE_NO_VALUE;
    _uchar_local = skipValue(pcVar1);
  } while (1 < (int)result);
  if (uchar == (uint)(ushort)*_uchar_local) {
    this->pos_ = _uchar_local + 1;
    node_00 = (uint)(ushort)_uchar_local[1];
    if (node_00 < 0x40) {
      local_48 = USTRINGTRIE_NO_VALUE;
    }
    else {
      local_48 = valueResult(node_00);
    }
    this_local._4_4_ = local_48;
  }
  else {
    stop(this);
    this_local._4_4_ = USTRINGTRIE_NO_MATCH;
  }
  return this_local._4_4_;
}

Assistant:

UStringTrieResult
UCharsTrie::branchNext(const UChar *pos, int32_t length, int32_t uchar) {
    // Branch according to the current unit.
    if(length==0) {
        length=*pos++;
    }
    ++length;
    // The length of the branch is the number of units to select from.
    // The data structure encodes a binary search.
    while(length>kMaxBranchLinearSubNodeLength) {
        if(uchar<*pos++) {
            length>>=1;
            pos=jumpByDelta(pos);
        } else {
            length=length-(length>>1);
            pos=skipDelta(pos);
        }
    }
    // Drop down to linear search for the last few units.
    // length>=2 because the loop body above sees length>kMaxBranchLinearSubNodeLength>=3
    // and divides length by 2.
    do {
        if(uchar==*pos++) {
            UStringTrieResult result;
            int32_t node=*pos;
            if(node&kValueIsFinal) {
                // Leave the final value for getValue() to read.
                result=USTRINGTRIE_FINAL_VALUE;
            } else {
                // Use the non-final value as the jump delta.
                ++pos;
                // int32_t delta=readValue(pos, node);
                int32_t delta;
                if(node<kMinTwoUnitValueLead) {
                    delta=node;
                } else if(node<kThreeUnitValueLead) {
                    delta=((node-kMinTwoUnitValueLead)<<16)|*pos++;
                } else {
                    delta=(pos[0]<<16)|pos[1];
                    pos+=2;
                }
                // end readValue()
                pos+=delta;
                node=*pos;
                result= node>=kMinValueLead ? valueResult(node) : USTRINGTRIE_NO_VALUE;
            }
            pos_=pos;
            return result;
        }
        --length;
        pos=skipValue(pos);
    } while(length>1);
    if(uchar==*pos++) {
        pos_=pos;
        int32_t node=*pos;
        return node>=kMinValueLead ? valueResult(node) : USTRINGTRIE_NO_VALUE;
    } else {
        stop();
        return USTRINGTRIE_NO_MATCH;
    }
}